

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_extract.cpp
# Opt level: O1

void __thiscall FNodeBuilder::ExtractMini(FNodeBuilder *this,FMiniBSP *bsp)

{
  TArray<vertex_t,_vertex_t> *this_00;
  TArray<subsector_t,_subsector_t> *this_01;
  TArray<node_t,_node_t> *this_02;
  TArray<seg_t,_seg_t> *this_03;
  undefined8 *puVar1;
  uint uVar2;
  vertex_t *pvVar3;
  FPrivVert *pFVar4;
  node_t *pnVar5;
  subsector_t *psVar6;
  seg_t *psVar7;
  FPrivSeg *pFVar8;
  USegPtr *pUVar9;
  FLevel *pFVar10;
  vertex_t *pvVar11;
  side_t *psVar12;
  line_t_conflict *plVar13;
  sector_t_conflict *psVar14;
  int iVar15;
  glseg_t *pgVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  sector_t_conflict **ppsVar21;
  long lVar22;
  int k;
  node_t *pnVar23;
  long lVar24;
  ulong uVar25;
  bool bVar26;
  TArray<FNodeBuilder::glseg_t,_FNodeBuilder::glseg_t> glsegs;
  TArray<FNodeBuilder::glseg_t,_FNodeBuilder::glseg_t> local_48;
  
  bsp->bDirty = false;
  this_00 = &bsp->Verts;
  TArray<vertex_t,_vertex_t>::Resize(this_00,(this->Vertices).Count);
  uVar18 = (ulong)(this->Vertices).Count;
  if (uVar18 != 0) {
    pvVar3 = this_00->Array;
    pFVar4 = (this->Vertices).Array;
    lVar19 = 0;
    do {
      iVar15 = *(int *)((long)&(pFVar4->super_FSimpleVert).y + lVar19);
      *(double *)((long)&(pvVar3->p).X + lVar19) =
           (double)*(int *)((long)&(pFVar4->super_FSimpleVert).x + lVar19) * 1.52587890625e-05;
      *(double *)((long)&(pvVar3->p).Y + lVar19) = (double)iVar15 * 1.52587890625e-05;
      lVar19 = lVar19 + 0x10;
    } while (uVar18 << 4 != lVar19);
  }
  this_01 = &bsp->Subsectors;
  TArray<subsector_t,_subsector_t>::Resize(this_01,(this->Subsectors).Count);
  memset((bsp->Subsectors).Array,0,(ulong)(this->Subsectors).Count * 0x30);
  this_02 = &bsp->Nodes;
  TArray<node_t,_node_t>::Resize(this_02,(this->Nodes).Count);
  memcpy((bsp->Nodes).Array,(this->Nodes).Array,(ulong)(this->Nodes).Count * 0x48);
  if ((this->Nodes).Count != 0) {
    lVar19 = 0x10;
    lVar17 = 0;
    uVar18 = 0;
    do {
      lVar20 = 0;
      do {
        pnVar5 = this_02->Array;
        uVar2 = *(uint *)((long)&pnVar5->field_6 + lVar20 * 4 + lVar17 + 4);
        if ((int)uVar2 < 0) {
          pnVar23 = (node_t *)((long)&this_01->Array[uVar2 & 0x7fffffff].sector + 1);
        }
        else {
          pnVar23 = pnVar5 + uVar2;
        }
        *(node_t **)((long)&pnVar5->field_6 + lVar20 * 8 + lVar17 + 8) = pnVar23;
        lVar20 = lVar20 + -1;
      } while (lVar20 != -2);
      lVar20 = lVar19;
      lVar22 = 0;
      do {
        lVar24 = 0;
        do {
          *(float *)((long)&this_02->Array->x + lVar24 * 4 + lVar20) =
               (float)*(int *)((long)&this_02->Array->x + lVar24 * 4 + lVar20) * 1.5258789e-05;
          lVar24 = lVar24 + 1;
        } while (lVar24 != 4);
        lVar20 = lVar20 + 0x10;
        bVar26 = lVar22 == 0;
        lVar22 = lVar22 + 1;
      } while (bVar26);
      uVar18 = uVar18 + 1;
      lVar17 = lVar17 + 0x48;
      lVar19 = lVar19 + 0x48;
    } while (uVar18 < (this->Nodes).Count);
  }
  if (this->GLNodes == true) {
    local_48.Array = (glseg_t *)0x0;
    local_48.Most = 0;
    local_48.Count = 0;
    if ((this->Subsectors).Count != 0) {
      lVar19 = 0x28;
      uVar18 = 0;
      do {
        iVar15 = CloseSubsector(this,&local_48,(int)uVar18,this_00->Array);
        psVar6 = (bsp->Subsectors).Array;
        *(int *)((long)&psVar6->sector + lVar19) = iVar15;
        *(seg_t **)((long)psVar6 + lVar19 + -0x10) =
             (bsp->Segs).Array + ((bsp->Segs).Count - iVar15);
        uVar18 = uVar18 + 1;
        lVar19 = lVar19 + 0x30;
      } while (uVar18 < (this->Subsectors).Count);
    }
    TArray<seg_t,_seg_t>::Resize(&bsp->Segs,local_48.Count);
    if ((ulong)local_48._8_8_ >> 0x20 != 0) {
      lVar19 = 0;
      pgVar16 = local_48.Array;
      do {
        psVar7 = (bsp->Segs).Array;
        pvVar3 = (pgVar16->super_seg_t).v1;
        pvVar11 = (pgVar16->super_seg_t).v2;
        psVar12 = (pgVar16->super_seg_t).sidedef;
        plVar13 = (pgVar16->super_seg_t).linedef;
        psVar14 = (pgVar16->super_seg_t).backsector;
        puVar1 = (undefined8 *)((long)&psVar7->frontsector + lVar19);
        *puVar1 = (pgVar16->super_seg_t).frontsector;
        puVar1[1] = psVar14;
        puVar1 = (undefined8 *)((long)&psVar7->sidedef + lVar19);
        *puVar1 = psVar12;
        puVar1[1] = plVar13;
        puVar1 = (undefined8 *)((long)&psVar7->v1 + lVar19);
        *puVar1 = pvVar3;
        puVar1[1] = pvVar11;
        pgVar16 = pgVar16 + 1;
        lVar19 = lVar19 + 0x30;
      } while (((ulong)local_48._8_8_ >> 0x20) * 0x30 != lVar19);
    }
    TArray<FNodeBuilder::glseg_t,_FNodeBuilder::glseg_t>::~TArray(&local_48);
  }
  else {
    memcpy((bsp->Subsectors).Array,(this->Subsectors).Array,(ulong)(this->Subsectors).Count * 0x30);
    this_03 = &bsp->Segs;
    TArray<seg_t,_seg_t>::Resize(this_03,(this->Segs).Count);
    uVar18 = (ulong)(this->Segs).Count;
    if (uVar18 != 0) {
      pFVar8 = (this->Segs).Array;
      pUVar9 = (this->SegList).Array;
      pvVar3 = this_00->Array;
      pFVar10 = this->Level;
      ppsVar21 = &this_03->Array->backsector;
      uVar25 = 0;
      do {
        uVar2 = pUVar9[uVar25].SegNum;
        ((seg_t *)(ppsVar21 + -5))->v1 = pvVar3 + pFVar8[uVar2].v1;
        ppsVar21[-4] = (sector_t_conflict *)(pvVar3 + pFVar8[uVar2].v2);
        *ppsVar21 = pFVar8[uVar2].backsector;
        ppsVar21[-1] = pFVar8[uVar2].frontsector;
        iVar15 = pFVar8[uVar2].sidedef;
        if ((long)iVar15 == -1) {
          ppsVar21[-3] = (sector_t_conflict *)0x0;
          ppsVar21[-2] = (sector_t_conflict *)0x0;
        }
        else {
          ppsVar21[-2] = (sector_t_conflict *)(pFVar10->Lines + pFVar8[uVar2].linedef);
          ppsVar21[-3] = (sector_t_conflict *)(pFVar10->Sides + iVar15);
        }
        uVar25 = uVar25 + 1;
        ppsVar21 = ppsVar21 + 6;
      } while (uVar18 != uVar25);
    }
    uVar18 = (ulong)(bsp->Subsectors).Count;
    if (uVar18 != 0) {
      psVar6 = this_01->Array;
      psVar7 = this_03->Array;
      lVar19 = 0;
      do {
        *(seg_t **)((long)&psVar6->firstline + lVar19) =
             psVar7 + *(long *)((long)&psVar6->firstline + lVar19);
        lVar19 = lVar19 + 0x30;
      } while (uVar18 * 0x30 != lVar19);
    }
  }
  return;
}

Assistant:

void FNodeBuilder::ExtractMini (FMiniBSP *bsp)
{
	unsigned int i;

	bsp->bDirty = false;
	bsp->Verts.Resize(Vertices.Size());
	for (i = 0; i < Vertices.Size(); ++i)
	{
		bsp->Verts[i].set(Vertices[i].x, Vertices[i].y);
	}

	bsp->Subsectors.Resize(Subsectors.Size());
	memset(&bsp->Subsectors[0], 0, Subsectors.Size() * sizeof(subsector_t));

	bsp->Nodes.Resize(Nodes.Size());
	memcpy(&bsp->Nodes[0], &Nodes[0], Nodes.Size()*sizeof(node_t));
	for (i = 0; i < Nodes.Size(); ++i)
	{
		D(Printf(PRINT_LOG, "Node %d:\n", i));
		// Go backwards because on 64-bit systems, both of the intchildren are
		// inside the first in-game child.
		for (int j = 1; j >= 0; --j)
		{
			if (bsp->Nodes[i].intchildren[j] & 0x80000000)
			{
				D(Printf(PRINT_LOG, "  subsector %d\n", bsp->Nodes[i].intchildren[j] & 0x7FFFFFFF));
				bsp->Nodes[i].children[j] = (BYTE *)&bsp->Subsectors[bsp->Nodes[i].intchildren[j] & 0x7fffffff] + 1;
			}
			else
			{
				D(Printf(PRINT_LOG, "  node %d\n", bsp->Nodes[i].intchildren[j]));
				bsp->Nodes[i].children[j] = &bsp->Nodes[bsp->Nodes[i].intchildren[j]];
			}
		}
		for (int j = 0; j < 2; ++j)
		{
			for (int k = 0; k < 4; ++k)
			{
				bsp->Nodes[i].bbox[j][k] = FIXED2FLOAT(bsp->Nodes[i].nb_bbox[j][k]);
			}
		}
	}

	if (GLNodes)
	{
		TArray<glseg_t> glsegs;
		for (i = 0; i < Subsectors.Size(); ++i)
		{
			DWORD numsegs = CloseSubsector (glsegs, i, &bsp->Verts[0]);
			bsp->Subsectors[i].numlines = numsegs;
			bsp->Subsectors[i].firstline = &bsp->Segs[bsp->Segs.Size() - numsegs];
		}
		bsp->Segs.Resize(glsegs.Size());
		for (i = 0; i < glsegs.Size(); ++i)
		{
			bsp->Segs[i] = *(seg_t *)&glsegs[i];
		}
	}
	else
	{
		memcpy(&bsp->Subsectors[0], &Subsectors[0], Subsectors.Size()*sizeof(subsector_t));
		bsp->Segs.Resize(Segs.Size());
		for (i = 0; i < Segs.Size(); ++i)
		{
			const FPrivSeg *org = &Segs[SegList[i].SegNum];
			seg_t *out = &bsp->Segs[i];

			D(Printf(PRINT_LOG, "Seg %d: v1(%d) -> v2(%d)\n", i, org->v1, org->v2));

			out->v1 = &bsp->Verts[org->v1];
			out->v2 = &bsp->Verts[org->v2];
			out->backsector = org->backsector;
			out->frontsector = org->frontsector;
			if (org->sidedef != int(NO_SIDE))
			{
				out->linedef = Level.Lines + org->linedef;
				out->sidedef = Level.Sides + org->sidedef;
			}
			else	// part of a miniseg
			{
				out->linedef = NULL;
				out->sidedef = NULL;
			}
		}
		for (i = 0; i < bsp->Subsectors.Size(); ++i)
		{
			bsp->Subsectors[i].firstline = &bsp->Segs[(size_t)bsp->Subsectors[i].firstline];
		}
	}
}